

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hamt_map.hpp
# Opt level: O2

pair<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>::iterator_base<false>,_bool>
* __thiscall
pstore::index::
hamt_map<std::__cxx11::string,std::__cxx11::string,(anonymous_namespace)::hash_function,std::equal_to<std::__cxx11::string>>
::insert<std::__cxx11::string_const,std::__cxx11::string,void>
          (pair<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>::iterator_base<false>,_bool>
           *__return_storage_ptr__,
          hamt_map<std::__cxx11::string,std::__cxx11::string,(anonymous_namespace)::hash_function,std::equal_to<std::__cxx11::string>>
          *this,transaction_base *transaction,
          pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *value)

{
  uint uVar1;
  index_pointer node;
  bool bVar2;
  uint uVar3;
  address aVar4;
  uint64_t hash;
  reference value_00;
  not_null<pstore::array_stack<pstore::index::details::parent_type,_13UL>_*> parents_00;
  pair<pstore::index::details::index_pointer,_bool> pVar5;
  database *this_00;
  not_null<pstore::array_stack<pstore::index::details::parent_type,_13UL>_*> local_2d8;
  database *local_2d0;
  undefined1 local_2c8 [216];
  hamt_map<std::__cxx11::string,std::__cxx11::string,(anonymous_namespace)::hash_function,std::equal_to<std::__cxx11::string>>
  *local_1f0;
  unique_ptr<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::default_delete<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1e8;
  parent_stack reverse_parents;
  parent_stack parents;
  
  this_00 = transaction->db_;
  uVar1 = *(uint *)(this + 0x10);
  parents_00.ptr_ = (array_stack<pstore::index::details::parent_type,_13UL> *)value;
  uVar3 = database::get_current_revision(this_00);
  if (uVar1 == uVar3) {
    memset((internal_node *)&parents,0,0xd8);
    bVar2 = hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::empty((hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)this);
    local_1f0 = this;
    if (bVar2) {
      reverse_parents.c_._M_elems[0].node.internal_ = (internal_node *)&parents;
      gsl::not_null<pstore::array_stack<pstore::index::details::parent_type,_13UL>_*>::
      ensure_invariant((not_null<pstore::array_stack<pstore::index::details::parent_type,_13UL>_*> *
                       )&reverse_parents);
      aVar4 = store_leaf_node<std::pair<std::__cxx11::string_const,std::__cxx11::string>>
                        ((hamt_map<std::__cxx11::string,std::__cxx11::string,(anonymous_namespace)::hash_function,std::equal_to<std::__cxx11::string>>
                          *)transaction,(transaction_base *)value,
                         (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)reverse_parents.c_._M_elems[0].node.internal_,parents_00);
      *(value_type *)(this + 0x18) = aVar4.a_;
      *(undefined8 *)(this + 0x20) = 1;
      local_2d0 = this_00;
      memcpy(local_2c8,(internal_node *)&parents,0xd8);
      (__return_storage_ptr__->first).db_ = this_00;
      memcpy(&(__return_storage_ptr__->first).visited_parents_,(internal_node *)&parents,0xd8);
      (__return_storage_ptr__->first).index_ =
           (hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)this;
      (__return_storage_ptr__->first).pos_._M_t.
      super___uniq_ptr_impl<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::default_delete<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::default_delete<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      .
      super__Head_base<0UL,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_false>
      ._M_head_impl =
           (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)0x0;
      __return_storage_ptr__->second = true;
    }
    else {
      memset(&reverse_parents,0,0xd8);
      hash = anon_unknown.dwarf_13be9a::hash_function::operator()
                       ((hash_function *)(this + 0x28),&value->first);
      node = *(index_pointer *)(this + 0x18);
      local_2d8.ptr_ = &reverse_parents;
      gsl::not_null<pstore::array_stack<pstore::index::details::parent_type,_13UL>_*>::
      ensure_invariant(&local_2d8);
      pVar5 = insert_node<std::pair<std::__cxx11::string_const,std::__cxx11::string>>
                        (this,transaction,node,value,hash,0,local_2d8,SUB81(this_00,0));
      *(index_pointer *)(this + 0x18) = pVar5.first;
      while (reverse_parents.elements_ != 0) {
        value_00 = array_stack<pstore::index::details::parent_type,_13UL>::top(&reverse_parents);
        array_stack<pstore::index::details::parent_type,_13UL>::push(&parents,value_00);
        array_stack<pstore::index::details::parent_type,_13UL>::pop(&reverse_parents);
      }
      if (((undefined1  [16])pVar5 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        *(long *)(this + 0x20) = *(long *)(this + 0x20) + 1;
      }
      local_2d0 = this_00;
      memcpy(local_2c8,&parents,0xd8);
      (__return_storage_ptr__->first).db_ = this_00;
      memcpy(&(__return_storage_ptr__->first).visited_parents_,&parents,0xd8);
      (__return_storage_ptr__->first).index_ =
           (hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)this;
      (__return_storage_ptr__->first).pos_._M_t.
      super___uniq_ptr_impl<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::default_delete<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::default_delete<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      .
      super__Head_base<0UL,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_false>
      ._M_head_impl =
           (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)0x0;
      __return_storage_ptr__->second = (bool)(pVar5.second ^ 1);
    }
    local_1e8._M_t.
    super___uniq_ptr_impl<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::default_delete<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::default_delete<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    .
    super__Head_base<0UL,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::default_delete<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::default_delete<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            )0x0;
    std::
    unique_ptr<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::default_delete<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~unique_ptr(&local_1e8);
    return __return_storage_ptr__;
  }
  raise<pstore::error_code>(index_not_latest_revision);
}

Assistant:

auto hamt_map<KeyType, ValueType, Hash, KeyEqual>::insert (
            transaction_base & transaction, std::pair<OtherKeyType, OtherValueType> const & value)
            -> std::pair<iterator, bool> {

            return this->insert_or_upsert (transaction, value, false /*is_upsert*/);
        }